

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.c
# Opt level: O1

void beg(monst *mtmp)

{
  uint uVar1;
  permonst *ppVar2;
  boolean bVar3;
  int iVar4;
  obj *poVar5;
  
  if (((*(uint *)&mtmp->field_0x60 & 0xc0000) != 0x40000) ||
     (ppVar2 = mtmp->data, (ppVar2->mflags1 & 0x60000000) == 0)) {
    return;
  }
  if ((byte)(ppVar2->msound - 1) < 0xd) {
    domonnoise(mtmp);
    return;
  }
  if (ppVar2->msound < 0x14) {
    return;
  }
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
          (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
        (((viz_array[mtmp->my][mtmp->mx] & 1U) != 0 && ((ppVar2->mflags3 & 0x200) != 0))))))
    goto LAB_00245696;
  }
  else {
    bVar3 = worm_known(level,mtmp);
    if (bVar3 != '\0') {
LAB_00245696:
      uVar1 = *(uint *)&mtmp->field_0x60;
      if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar1 & 0x280) == 0) goto LAB_002456de;
      }
      else if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_002456de:
        if ((u._1052_1_ & 0x20) == 0) goto LAB_0024585c;
      }
    }
  }
  if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
       ((poVar5 = which_armor(mtmp,4), poVar5 != (obj *)0x0 &&
        (poVar5 = which_armor(mtmp,4), poVar5->otyp == 0x4f)))) ||
      ((((u.uprops[0x1e].intrinsic == 0 &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
         ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
           (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
           youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) &&
       (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
        (iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar4)))))) &&
     (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
      (bVar3 = match_warn_of_mon(mtmp), bVar3 == '\0')))) {
    map_invisible(mtmp->mx,mtmp->my);
  }
LAB_0024585c:
  verbalize("I\'m hungry.");
  return;
}

Assistant:

void beg(struct monst *mtmp)
{
    if (mtmp->msleeping || !mtmp->mcanmove ||
	    !(carnivorous(mtmp->data) || herbivorous(mtmp->data)))
	return;

    /* presumably nearness and soundok checks have already been made */
    if (!is_silent(mtmp->data) && mtmp->data->msound <= MS_ANIMAL)
	domonnoise(mtmp);
    else if (mtmp->data->msound >= MS_HUMANOID) {
	if (!canspotmon(level, mtmp))
	    map_invisible(mtmp->mx, mtmp->my);
	verbalize("I'm hungry.");
    }
}